

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O0

PrettyPrinterNode * getFirstBadLine(PrettyPrinterNode *start,int line_length)

{
  int in_ESI;
  PrettyPrinterNode *in_RDI;
  PrettyPrinterNode *currentLineNode;
  int currentLine;
  PrettyPrinterNode *local_20;
  int local_18;
  PrettyPrinterNode *local_10;
  
  if (((in_RDI->is_line_separator ^ 0xffU) & 1) == 0) {
    __assert_fail("!start->is_line_separator",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/util/LispPrint.cpp"
                  ,0x13c,"PrettyPrinterNode *getFirstBadLine(PrettyPrinterNode *, int)");
  }
  local_18 = in_RDI->line;
  local_20 = in_RDI;
  local_10 = in_RDI;
  while( true ) {
    for (; (local_10->is_line_separator & 1U) != 0; local_10 = local_10->next) {
      if (local_10->next == (PrettyPrinterNode *)0x0) {
        __assert_fail("start->next",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/util/LispPrint.cpp"
                      ,0x141,"PrettyPrinterNode *getFirstBadLine(PrettyPrinterNode *, int)");
      }
    }
    if (local_10->line != local_18) {
      local_18 = local_10->line;
      local_20 = local_10;
    }
    if (in_ESI < local_10->offset) break;
    if (local_10->next == (PrettyPrinterNode *)0x0) {
      return (PrettyPrinterNode *)0x0;
    }
    local_10 = local_10->next;
  }
  return local_20;
}

Assistant:

static PrettyPrinterNode* getFirstBadLine(PrettyPrinterNode* start, int line_length) {
  assert(!start->is_line_separator);
  int currentLine = start->line;
  auto* currentLineNode = start;
  for(;;) {
    if(start->is_line_separator) {
      assert(start->next);
      start = start->next;
    } else {
      if(start->line != currentLine) {
        currentLine = start->line;
        currentLineNode = start;
      }
      if(start->offset > line_length) {
        return currentLineNode;
      }
      if(!start->next) {
        return nullptr;
      }
      start = start->next;
    }
  }
}